

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall
QMessageBoxPrivate::setClickedButton(QMessageBoxPrivate *this,QAbstractButton *button)

{
  QMessageBox *this_00;
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  undefined8 extraout_RDX;
  
  this_00 = *(QMessageBox **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  this->clickedButton = button;
  QMessageBox::buttonClicked(this_00,button);
  iVar1 = execReturnCode(this,button);
  UNRECOVERED_JUMPTABLE = *(code **)(*(long *)&(this_00->super_QDialog).super_QWidget + 0x1b0);
  (*UNRECOVERED_JUMPTABLE)(this_00,iVar1,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void QMessageBoxPrivate::setClickedButton(QAbstractButton *button)
{
    Q_Q(QMessageBox);

    clickedButton = button;
    emit q->buttonClicked(clickedButton);

    auto resultCode = execReturnCode(button);
    q->done(resultCode);
}